

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate_threaded
          (pair<subprocess::Buffer,_subprocess::Buffer> *__return_storage_ptr__,Communication *this,
          char *msg,size_t length)

{
  FILE *__s;
  int iVar1;
  Streams *pSVar2;
  size_t sVar3;
  int *piVar4;
  OSError *this_00;
  int iVar5;
  long in_FS_OFFSET;
  OutBuffer *local_c8;
  Communication *local_c0;
  future<int> err_fut;
  future<int> out_fut;
  ErrBuffer ebuf;
  OutBuffer obuf;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  obuf.length = 0;
  obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ebuf.length = 0;
  ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  out_fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  out_fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  err_fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  err_fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pSVar2 = this->stream_;
  if ((pSVar2->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::vector<char,_std::allocator<char>_>::resize(&obuf.buf,this->out_buf_cap_);
    local_c8 = &obuf;
    local_c0 = this;
    std::
    async<subprocess::detail::Communication::communicate_threaded(char_const*,unsigned_long)::_lambda()_1_>
              ((launch)&local_58,(anon_class_16_2_3f9d3413_for__M_head_impl *)0x1);
    std::future<int>::operator=(&out_fut,(future<int> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
    pSVar2 = this->stream_;
  }
  if ((pSVar2->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::vector<char,_std::allocator<char>_>::resize(&ebuf.buf,this->err_buf_cap_);
    local_c8 = &ebuf;
    local_c0 = this;
    std::
    async<subprocess::detail::Communication::communicate_threaded(char_const*,unsigned_long)::_lambda()_2_>
              ((launch)&local_58,(anon_class_16_2_3f104909_for__M_head_impl *)0x1);
    std::future<int>::operator=(&err_fut,(future<int> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
    pSVar2 = this->stream_;
  }
  __s = (FILE *)(pSVar2->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__s != (FILE *)0x0) {
    if (msg != (char *)0x0) {
      sVar3 = fwrite(msg,1,length,__s);
      if ((int)sVar3 < (int)length) {
        piVar4 = __errno_location();
        if ((*piVar4 != 0x16) && (*piVar4 != 0x20)) {
          this_00 = (OSError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"fwrite error",(allocator<char> *)&local_c8);
          OSError::OSError(this_00,&local_58,*piVar4);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(this_00,&OSError::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00360d28;
        }
      }
    }
    std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)this->stream_);
  }
  if (out_fut.super___basic_future<int>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = std::future<int>::get(&out_fut);
    iVar5 = 0;
    if (iVar1 != -1) {
      iVar5 = iVar1;
    }
    obuf.length = (size_t)iVar5;
  }
  if (err_fut.super___basic_future<int>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = std::future<int>::get(&err_fut);
    iVar5 = 0;
    if (iVar1 != -1) {
      iVar5 = iVar1;
    }
    ebuf.length = (size_t)iVar5;
  }
  std::pair<subprocess::Buffer,_subprocess::Buffer>::
  pair<subprocess::Buffer,_subprocess::Buffer,_true>(__return_storage_ptr__,&obuf,&ebuf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&err_fut.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out_fut.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&ebuf);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&obuf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00360d28:
  __stack_chk_fail();
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate_threaded(const char* msg, size_t length)
  {
    OutBuffer obuf;
    ErrBuffer ebuf;
    std::future<int> out_fut, err_fut;
    const int length_conv = length;

    if (stream_->output()) {
      obuf.add_cap(out_buf_cap_);

      out_fut = std::async(std::launch::async,
                          [&obuf, this] {
                            return util::read_all(this->stream_->output(), obuf.buf);
                          });
    }
    if (stream_->error()) {
      ebuf.add_cap(err_buf_cap_);

      err_fut = std::async(std::launch::async,
                          [&ebuf, this] {
                            return util::read_all(this->stream_->error(), ebuf.buf);
                          });
    }
    if (stream_->input()) {
      if (msg) {
        int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
        if (wbytes < length_conv) {
          if (errno != EPIPE && errno != EINVAL) {
            throw OSError("fwrite error", errno);
          }
        }
      }
      stream_->input_.reset();
    }

    if (out_fut.valid()) {
      int res = out_fut.get();
      if (res != -1) obuf.length = res;
      else obuf.length = 0;
    }
    if (err_fut.valid()) {
      int res = err_fut.get();
      if (res != -1) ebuf.length = res;
      else ebuf.length = 0;
    }

    return std::make_pair(std::move(obuf), std::move(ebuf));
  }